

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O0

void __thiscall
spdlog::details::circular_q<spdlog::details::log_msg_buffer>::copy_moveable
          (circular_q<spdlog::details::log_msg_buffer> *this,
          circular_q<spdlog::details::log_msg_buffer> *other)

{
  circular_q<spdlog::details::log_msg_buffer> *other_local;
  circular_q<spdlog::details::log_msg_buffer> *this_local;
  
  this->max_items_ = other->max_items_;
  this->head_ = other->head_;
  this->tail_ = other->tail_;
  this->overrun_counter_ = other->overrun_counter_;
  std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
  operator=(&this->v_,&other->v_);
  other->max_items_ = 0;
  other->tail_ = 0;
  other->head_ = 0;
  other->overrun_counter_ = 0;
  return;
}

Assistant:

void copy_moveable(circular_q &&other) SPDLOG_NOEXCEPT {
        max_items_ = other.max_items_;
        head_ = other.head_;
        tail_ = other.tail_;
        overrun_counter_ = other.overrun_counter_;
        v_ = std::move(other.v_);

        // put &&other in disabled, but valid state
        other.max_items_ = 0;
        other.head_ = other.tail_ = 0;
        other.overrun_counter_ = 0;
    }